

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executor_op.hpp
# Opt level: O0

void asio::detail::
     executor_op<asio::detail::work_dispatcher<asio::detail::binder1<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/catid[P]tonk/TonkineseNAT.cpp:1590:9),_std::error_code>_>,_asio::detail::recycling_allocator<void>,_asio::detail::scheduler_operation>
     ::do_complete(void *owner,scheduler_operation *base,error_code *param_3,size_t param_4)

{
  long in_RSI;
  long in_RDI;
  fenced_block b;
  work_dispatcher<asio::detail::binder1<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_catid[P]tonk_TonkineseNAT_cpp:1590:9),_std::error_code>_>
  handler;
  ptr p;
  executor_op<asio::detail::work_dispatcher<asio::detail::binder1<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_catid[P]tonk_TonkineseNAT_cpp:1590:9),_std::error_code>_>,_asio::detail::recycling_allocator<void>,_asio::detail::scheduler_operation>
  *o;
  undefined4 in_stack_ffffffffffffff88;
  half_t in_stack_ffffffffffffff8c;
  work_dispatcher<asio::detail::binder1<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_catid[P]tonk_TonkineseNAT_cpp:1590:9),_std::error_code>_>
  *in_stack_ffffffffffffff90;
  work_dispatcher<asio::detail::binder1<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_catid[P]tonk_TonkineseNAT_cpp:1590:9),_std::error_code>_>
  *in_stack_ffffffffffffff98;
  work_dispatcher<asio::detail::binder1<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_catid[P]tonk_TonkineseNAT_cpp:1590:9),_std::error_code>_>
  *in_stack_ffffffffffffffa0;
  recycling_allocator<asio::detail::executor_op<asio::detail::work_dispatcher<asio::detail::binder1<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_catid[P]tonk_TonkineseNAT_cpp:1590:9),_std::error_code>_>,_asio::detail::recycling_allocator<void>,_asio::detail::scheduler_operation>_>
  local_40 [8];
  long local_38;
  long local_30;
  long local_28;
  long local_8;
  
  local_28 = in_RSI;
  local_8 = in_RDI;
  recycling_allocator<asio::detail::executor_op<asio::detail::work_dispatcher<asio::detail::binder1<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/catid[P]tonk/TonkineseNAT.cpp:1590:9),_std::error_code>_>,_asio::detail::recycling_allocator<void>,_asio::detail::scheduler_operation>_>
  ::recycling_allocator<void>(local_40,(recycling_allocator<void> *)(in_RSI + 0x38));
  local_38 = local_28;
  local_30 = local_28;
  work_dispatcher<asio::detail::binder1<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/catid[P]tonk/TonkineseNAT.cpp:1590:9),_std::error_code>_>
  ::work_dispatcher(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  ptr::reset((ptr *)in_stack_ffffffffffffff90);
  if (local_8 != 0) {
    gcc_x86_fenced_block::gcc_x86_fenced_block
              ((gcc_x86_fenced_block *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
    asio_handler_invoke_helpers::
    invoke<asio::detail::work_dispatcher<asio::detail::binder1<tonk::gateway::HTTPRequester::Begin(tonk::gateway::ParsedURL_const&,tonk::gateway::AsioHost*,std::__cxx11::string_const&,std::function<void(tonk::Result_const&,unsigned_int,char_const*,unsigned_int)>const&)::__0,std::error_code>>,asio::detail::work_dispatcher<asio::detail::binder1<tonk::gateway::HTTPRequester::Begin(tonk::gateway::ParsedURL_const&,tonk::gateway::AsioHost*,std::__cxx11::string_const&,std::function<void(tonk::Result_const&,unsigned_int,char_const*,unsigned_int)>const&)::__0,std::error_code>>>
              (in_stack_ffffffffffffff90,
               (work_dispatcher<asio::detail::binder1<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_catid[P]tonk_TonkineseNAT_cpp:1590:9),_std::error_code>_>
                *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
    gcc_x86_fenced_block::~gcc_x86_fenced_block((gcc_x86_fenced_block *)in_stack_ffffffffffffff90);
  }
  work_dispatcher<asio::detail::binder1<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/catid[P]tonk/TonkineseNAT.cpp:1590:9),_std::error_code>_>
  ::~work_dispatcher((work_dispatcher<asio::detail::binder1<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_catid[P]tonk_TonkineseNAT_cpp:1590:9),_std::error_code>_>
                      *)0x2169df);
  ptr::~ptr((ptr *)0x2169e9);
  return;
}

Assistant:

static void do_complete(void* owner, Operation* base,
      const asio::error_code& /*ec*/,
      std::size_t /*bytes_transferred*/)
  {
    // Take ownership of the handler object.
    executor_op* o(static_cast<executor_op*>(base));
    ptr p = { o->allocator_, o, o };

    ASIO_HANDLER_COMPLETION((*o));

    // Make a copy of the handler so that the memory can be deallocated before
    // the upcall is made. Even if we're not about to make an upcall, a
    // sub-object of the handler may be the true owner of the memory associated
    // with the handler. Consequently, a local copy of the handler is required
    // to ensure that any owning sub-object remains valid until after we have
    // deallocated the memory here.
    Handler handler(ASIO_MOVE_CAST(Handler)(o->handler_));
    p.reset();

    // Make the upcall if required.
    if (owner)
    {
      fenced_block b(fenced_block::half);
      ASIO_HANDLER_INVOCATION_BEGIN(());
      asio_handler_invoke_helpers::invoke(handler, handler);
      ASIO_HANDLER_INVOCATION_END;
    }
  }